

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O2

void Curl_http2_remove_child(Curl_easy *parent,Curl_easy *child)

{
  undefined1 *puVar1;
  Curl_http2_dep *pCVar2;
  Curl_http2_dep **ppCVar3;
  Curl_http2_dep *pCVar4;
  Curl_http2_dep **ppCVar5;
  
  ppCVar5 = &(parent->set).stream_dependents;
  pCVar2 = (Curl_http2_dep *)(Curl_http2_dep **)0x0;
  pCVar4 = (Curl_http2_dep *)ppCVar5;
  do {
    ppCVar3 = &pCVar2->next;
    pCVar4 = pCVar4->next;
    if (pCVar4 == (Curl_http2_dep *)0x0) goto LAB_0010bb46;
    pCVar2 = pCVar4;
  } while (pCVar4->data != child);
  if (ppCVar3 != (Curl_http2_dep **)0x0) {
    ppCVar5 = ppCVar3;
  }
  *ppCVar5 = pCVar4->next;
  (*Curl_cfree)(pCVar4);
LAB_0010bb46:
  (child->set).stream_depends_on = (Curl_easy *)0x0;
  puVar1 = &(child->set).field_0x8e7;
  *puVar1 = *puVar1 & 0xdf;
  return;
}

Assistant:

void Curl_http2_remove_child(struct Curl_easy *parent, struct Curl_easy *child)
{
  struct Curl_http2_dep *last = 0;
  struct Curl_http2_dep *data = parent->set.stream_dependents;
  DEBUGASSERT(child->set.stream_depends_on == parent);

  while(data && data->data != child) {
    last = data;
    data = data->next;
  }

  DEBUGASSERT(data);

  if(data) {
    if(last) {
      last->next = data->next;
    }
    else {
      parent->set.stream_dependents = data->next;
    }
    free(data);
  }

  child->set.stream_depends_on = 0;
  child->set.stream_depends_e = FALSE;
}